

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  uint *puVar1;
  undefined4 uVar2;
  stbtt__point sVar3;
  stbtt__point sVar4;
  undefined4 uVar5;
  stbtt_uint8 sVar6;
  byte bVar7;
  short sVar8;
  short sVar9;
  ushort uVar10;
  undefined4 uVar11;
  stbtt_uint8 *data;
  uint *puVar12;
  undefined4 uVar14;
  undefined8 *puVar13;
  ImFont *font;
  stbrp_node *psVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [14];
  unkuint10 Var19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  unkbyte10 Var22;
  undefined1 auVar23 [13];
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  uint6 uVar32;
  void *pvVar33;
  bool bVar34;
  stbtt_uint32 sVar35;
  stbtt_uint32 sVar36;
  stbtt_uint32 sVar37;
  stbtt_uint32 sVar38;
  stbtt_uint32 sVar39;
  stbtt_uint32 sVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  undefined4 extraout_var;
  ushort *puVar44;
  stbrp_context *ptr;
  stbrp_node *ptr_00;
  uchar *puVar45;
  long lVar46;
  stbtt__edge *psVar47;
  stbtt__buf *scanline;
  undefined8 *puVar48;
  stbtt__active_edge *psVar49;
  long *plVar50;
  ushort uVar51;
  ushort uVar52;
  uint uVar53;
  long lVar54;
  ImWchar *pIVar55;
  ulong uVar56;
  stbtt__active_edge *psVar57;
  stbtt__buf *psVar58;
  long lVar59;
  float fVar60;
  long lVar61;
  stbtt__active_edge *psVar62;
  byte *pbVar63;
  int *piVar64;
  uint uVar65;
  uint uVar66;
  stbtt__active_edge *psVar67;
  ImFontBuildDstData *pIVar68;
  ulong uVar69;
  stbtt__edge *psVar70;
  ulong uVar71;
  ulong uVar72;
  uchar *puVar73;
  byte *pbVar74;
  ImFontConfig *pIVar75;
  int iVar76;
  int iVar77;
  stbtt__point *ptr_01;
  ulong uVar78;
  ImFontAtlas *pIVar79;
  int iVar80;
  ImVector<int> *this_00;
  long lVar81;
  uchar *puVar82;
  stbtt_fontinfo *psVar83;
  bool bVar84;
  byte bVar85;
  char cVar93;
  char cVar94;
  float fVar86;
  float fVar87;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar88 [16];
  char cVar95;
  undefined4 uVar96;
  undefined1 extraout_var_00 [12];
  undefined4 uVar97;
  undefined4 uVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float in_XMM3_Da;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar107 [16];
  float fVar108;
  float fVar109;
  stbtt__buf sVar110;
  uint uStack_49c;
  int iStack_498;
  stbtt_uint32 sStack_494;
  ulong uStack_490;
  undefined8 uStack_488;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  ImFontAtlas *pIStack_478;
  undefined1 auStack_470 [16];
  void *pvStack_460;
  float fStack_454;
  void *pvStack_450;
  undefined1 auStack_448 [16];
  stbtt__edge *psStack_438;
  stbtt__point *psStack_430;
  undefined8 uStack_428;
  int iStack_420;
  float fStack_41c;
  ImVector<stbrp_rect> IStack_418;
  float *pfStack_400;
  uint uStack_3f8;
  uint uStack_3f4;
  int iStack_3f0;
  float fStack_3ec;
  ImVector<ImFontBuildDstData> IStack_3e8;
  ImVector<stbtt_packedchar> IStack_3d8;
  long lStack_3c0;
  long lStack_3b8;
  undefined8 *puStack_3b0;
  undefined1 auStack_3a8 [16];
  uchar *puStack_390;
  stbtt_fontinfo *psStack_388;
  ulong uStack_380;
  uchar *puStack_378;
  int iStack_370;
  float fStack_36c;
  float fStack_368;
  int iStack_364;
  float fStack_360;
  uint uStack_35c;
  stbrp_context *psStack_358;
  long lStack_350;
  stbrp_node *psStack_348;
  ulong uStack_340;
  uint *puStack_338;
  long lStack_330;
  long lStack_328;
  stbtt__edge *psStack_320;
  ulong uStack_318;
  ulong uStack_310;
  float fStack_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  ImFontConfig *pIStack_2f8;
  long lStack_2f0;
  uchar *puStack_2e8;
  long lStack_2e0;
  long lStack_2d8;
  long lStack_2d0;
  size_t sStack_2c8;
  size_t sStack_2c0;
  ulong uStack_2b8;
  int iStack_2b0;
  int iStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 auStack_278 [16];
  undefined1 auStack_268 [16];
  undefined1 auStack_258 [16];
  float fStack_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  stbtt__buf asStack_238 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar34 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar34;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  auStack_470._8_8_ = 0;
  pvStack_460 = (void *)0x0;
  IStack_3e8.Size = 0;
  IStack_3e8.Capacity = 0;
  IStack_3e8.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize
            ((ImVector<ImFontBuildSrcData> *)(auStack_470 + 8),(this->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&IStack_3e8,(this->Fonts).Size);
  lVar61 = 0;
  memset(pvStack_460,0,(long)(int)auStack_470._8_4_ * 0x110);
  memset(IStack_3e8.Data,0,(long)IStack_3e8.Size << 5);
  pIStack_478 = this;
  while( true ) {
    pvVar33 = pvStack_460;
    lStack_2f0 = (long)(pIStack_478->ConfigData).Size;
    lStack_3c0 = lVar61;
    if (lStack_2f0 <= lVar61) break;
    pIVar75 = (pIStack_478->ConfigData).Data + lVar61;
    *(undefined4 *)((long)pvStack_460 + lVar61 * 0x110 + 0xe0) = 0xffffffff;
    iVar41 = (pIStack_478->Fonts).Size;
    lVar54 = 0;
    lVar81 = -1;
    while ((iVar43 = (int)lVar81, lVar54 < iVar41 && (iVar43 == -1))) {
      lVar81 = -1;
      if (pIVar75->DstFont == (pIStack_478->Fonts).Data[lVar54]) {
        *(int *)((long)pvStack_460 + lVar61 * 0x110 + 0xe0) = (int)lVar54;
        lVar81 = lVar54;
      }
      lVar54 = lVar54 + 1;
    }
    auStack_448._0_8_ = pIVar75;
    lVar81 = lVar61;
    if (iVar43 == -1) goto LAB_0012d001;
    data = (stbtt_uint8 *)pIVar75->FontData;
    iVar41 = pIVar75->FontNo;
    sVar6 = *data;
    if (sVar6 == '\0') {
      sVar40 = 0xffffffff;
      if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0012a9b3;
LAB_0012a9a9:
      sVar40 = -(uint)(iVar41 != 0);
    }
    else {
      sVar40 = 0xffffffff;
      if (sVar6 == 't') {
        sVar6 = data[1];
        if (sVar6 == 'r') {
          if (data[2] == 'u') {
            bVar34 = data[3] == 'e';
            goto LAB_0012a9a5;
          }
        }
        else if (sVar6 == 't') {
          if ((((data[2] == 'c') && (data[3] == 'f')) &&
              ((sVar35 = ttULONG(data + 4), sVar35 == 0x20000 || (sVar35 == 0x10000)))) &&
             (uVar65 = *(uint *)(data + 8),
             iVar41 < (int)(uVar65 >> 0x18 | (uVar65 & 0xff0000) >> 8 | (uVar65 & 0xff00) << 8 |
                           uVar65 << 0x18))) {
            sVar40 = ttULONG(data + (long)iVar41 * 4 + 0xc);
          }
        }
        else if ((sVar6 == 'y') && (data[2] == 'p')) {
          bVar34 = data[3] == '1';
          goto LAB_0012a9a5;
        }
      }
      else if (sVar6 == 'O') {
        if ((data[1] == 'T') && (data[2] == 'T')) {
          bVar34 = data[3] == 'O';
          goto LAB_0012a9a5;
        }
      }
      else if (((sVar6 == '1') && (data[1] == '\0')) && (data[2] == '\0')) {
        bVar34 = data[3] == '\0';
LAB_0012a9a5:
        if (bVar34) goto LAB_0012a9a9;
      }
    }
LAB_0012a9b3:
    *(stbtt_uint8 **)((long)pvVar33 + lVar61 * 0x110 + 8) = data;
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x10) = sVar40;
    *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x40) = 0;
    *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x48) = 0;
    sVar35 = stbtt__find_table(data,sVar40,"cmap");
    uStack_488 = (ImFontBuildDstData *)CONCAT44(extraout_var,sVar35);
    sVar35 = stbtt__find_table(data,sVar40,"loca");
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x18) = sVar35;
    sVar36 = stbtt__find_table(data,sVar40,"head");
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x1c) = sVar36;
    sVar37 = stbtt__find_table(data,sVar40,"glyf");
    uStack_490 = CONCAT44(uStack_490._4_4_,sVar37);
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x20) = sVar37;
    sVar37 = stbtt__find_table(data,sVar40,"hhea");
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x24) = sVar37;
    sVar38 = stbtt__find_table(data,sVar40,"hmtx");
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x28) = sVar38;
    sVar39 = stbtt__find_table(data,sVar40,"kern");
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x2c) = sVar39;
    sVar39 = stbtt__find_table(data,sVar40,"GPOS");
    *(stbtt_uint32 *)((long)pvVar33 + lVar61 * 0x110 + 0x30) = sVar39;
    lVar81 = lStack_3c0;
    if ((((float)uStack_488 == 0.0) || (sVar36 == 0)) || ((sVar37 == 0 || (sVar38 == 0))))
    goto LAB_0012d001;
    if ((float)uStack_490 == 0.0) {
      auStack_470._0_8_ = auStack_470._0_8_ & 0xffffffff00000000;
      uStack_428._0_4_ = 0;
      IStack_3d8.Size = 2;
      sStack_494 = 0;
      sVar35 = stbtt__find_table(data,sVar40,"CFF ");
      lVar81 = lStack_3c0;
      if (sVar35 == 0) goto LAB_0012d001;
      *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x90) = 0;
      *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x98) = 0;
      *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x80) = 0;
      *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x88) = 0;
      *(stbtt_uint8 **)((long)pvVar33 + lVar61 * 0x110 + 0x40) = data + sVar35;
      *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x48) = 0x2000000000000000;
      lVar81 = *(long *)((long)pvVar33 + lVar61 * 0x110 + 0x40);
      uVar16 = *(undefined8 *)((long)pvVar33 + lVar61 * 0x110 + 0x48);
      asStack_238[0].data._0_4_ = (int)lVar81;
      asStack_238[0].data._4_4_ = (undefined4)((ulong)lVar81 >> 0x20);
      asStack_238[0].cursor = (int)uVar16;
      asStack_238[0].size = (int)((ulong)uVar16 >> 0x20);
      uVar65 = asStack_238[0].cursor + 2U;
      if (asStack_238[0].size < (int)(asStack_238[0].cursor + 2U)) {
        uVar65 = asStack_238[0].size;
      }
      if (asStack_238[0].cursor < -2) {
        uVar65 = asStack_238[0].size;
      }
      asStack_238[0].cursor = 0;
      if ((int)uVar65 < asStack_238[0].size) {
        asStack_238[0].cursor = (int)*(byte *)(lVar81 + (int)uVar65);
      }
      if (asStack_238[0].size < asStack_238[0].cursor) {
        asStack_238[0].cursor = asStack_238[0].size;
      }
      stbtt__cff_get_index(asStack_238);
      sVar110 = stbtt__cff_get_index(asStack_238);
      IStack_418 = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar110,0);
      stbtt__cff_get_index(asStack_238);
      sVar110 = stbtt__cff_get_index(asStack_238);
      *(stbtt__buf *)((long)pvVar33 + lVar61 * 0x110 + 0x60) = sVar110;
      stbtt__dict_get_ints((stbtt__buf *)&IStack_418,0x11,1,(stbtt_uint32 *)auStack_470);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_418,0x106,1,(stbtt_uint32 *)&IStack_3d8);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_418,0x124,1,(stbtt_uint32 *)&uStack_428);
      stbtt__dict_get_ints((stbtt__buf *)&IStack_418,0x125,1,&sStack_494);
      uVar65 = asStack_238[0].size;
      sVar110.data._4_4_ = asStack_238[0].data._4_4_;
      sVar110.data._0_4_ = (int)asStack_238[0].data;
      sVar110.cursor = asStack_238[0].cursor;
      sVar110.size = asStack_238[0].size;
      sVar110 = stbtt__get_subrs(sVar110,(stbtt__buf)IStack_418);
      sVar35 = sStack_494;
      *(stbtt__buf *)((long)pvVar33 + lVar61 * 0x110 + 0x70) = sVar110;
      lVar81 = lStack_3c0;
      if ((IStack_3d8.Size != 2) || (uVar96 = auStack_470._0_4_, auStack_470._0_4_ == 0))
      goto LAB_0012d001;
      if ((uint)uStack_428 != 0) {
        if (sStack_494 == 0) goto LAB_0012d001;
        asStack_238[0].cursor = (uint)uStack_428;
        if ((int)uVar65 < (int)(uint)uStack_428) {
          asStack_238[0].cursor = uVar65;
        }
        if ((int)(uint)uStack_428 < 0) {
          asStack_238[0].cursor = uVar65;
        }
        sVar110 = stbtt__cff_get_index(asStack_238);
        uVar65 = asStack_238[0].size;
        *(stbtt__buf *)((long)pvVar33 + lVar61 * 0x110 + 0x80) = sVar110;
        sVar110 = stbtt__buf_range(asStack_238,sVar35,asStack_238[0].size - sVar35);
        *(stbtt__buf *)((long)pvVar33 + lVar61 * 0x110 + 0x90) = sVar110;
      }
      asStack_238[0].cursor = uVar96;
      if ((int)uVar65 < (int)uVar96) {
        asStack_238[0].cursor = uVar65;
      }
      if ((int)uVar96 < 0) {
        asStack_238[0].cursor = uVar65;
      }
      sVar110 = stbtt__cff_get_index(asStack_238);
      *(stbtt__buf *)((long)pvVar33 + lVar61 * 0x110 + 0x50) = sVar110;
    }
    else if (sVar35 == 0) goto LAB_0012d001;
    lVar81 = lStack_3c0;
    sVar40 = stbtt__find_table(data,sVar40,"maxp");
    if (sVar40 == 0) {
      uVar65 = 0xffff;
    }
    else {
      uVar65 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar40 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar40 + 4) >> 8);
    }
    *(uint *)((long)pvVar33 + lVar61 * 0x110 + 0x14) = uVar65;
    uVar51 = *(ushort *)(data + ((ulong)uStack_488 & 0xffffffff) + 2);
    *(undefined4 *)((long)pvVar33 + lVar61 * 0x110 + 0x34) = 0;
    uVar78 = (ulong)(ushort)(uVar51 << 8 | uVar51 >> 8);
    uVar65 = (int)uStack_488 + 4;
    iVar41 = 0;
    while( true ) {
      bVar34 = uVar78 == 0;
      uVar78 = uVar78 - 1;
      if (bVar34) break;
      uVar51 = *(ushort *)(data + uVar65) << 8 | *(ushort *)(data + uVar65) >> 8;
      if ((uVar51 == 0) ||
         ((uVar51 == 3 &&
          ((uVar51 = *(ushort *)(data + (ulong)uVar65 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar65 + 2) >> 8, uVar51 == 10 || (uVar51 == 1))))))
      {
        sVar40 = ttULONG(data + (ulong)uVar65 + 4);
        iVar41 = sVar40 + (int)(float)uStack_488;
        *(int *)((long)pvVar33 + lVar61 * 0x110 + 0x34) = iVar41;
      }
      uVar65 = uVar65 + 8;
    }
    if (iVar41 == 0) goto LAB_0012d001;
    *(uint *)((long)pvVar33 + lVar61 * 0x110 + 0x38) =
         (uint)(ushort)(*(ushort *)(data + (long)(int)sVar36 + 0x32) << 8 |
                       *(ushort *)(data + (long)(int)sVar36 + 0x32) >> 8);
    pIVar68 = IStack_3e8.Data + iVar43;
    pIVar55 = *(ImWchar **)(auStack_448._0_8_ + 0x38);
    if (pIVar55 == (ImWchar *)0x0) {
      pIVar55 = GetGlyphRangesDefault::ranges;
    }
    *(ImWchar **)((long)pvVar33 + lVar61 * 0x110 + 0xd8) = pIVar55;
    for (; *pIVar55 != 0; pIVar55 = pIVar55 + 2) {
      uVar51 = pIVar55[1];
      uVar65 = *(uint *)((long)pvVar33 + lVar61 * 0x110 + 0xe4);
      if (uVar51 == 0) goto LAB_0012ae42;
      uVar66 = (uint)uVar51;
      if ((int)(uint)uVar51 < (int)uVar65) {
        uVar66 = uVar65;
      }
      *(uint *)((long)pvVar33 + lVar61 * 0x110 + 0xe4) = uVar66;
    }
    uVar65 = *(uint *)((long)pvVar33 + lVar61 * 0x110 + 0xe4);
LAB_0012ae42:
    pIVar68->SrcCount = pIVar68->SrcCount + 1;
    if ((int)uVar65 < pIVar68->GlyphsHighest) {
      uVar65 = pIVar68->GlyphsHighest;
    }
    pIVar68->GlyphsHighest = uVar65;
    lVar61 = lVar81 + 1;
  }
  lVar61 = 0;
  auVar100._12_4_ = 0;
  auVar100._0_12_ = auStack_448._4_12_;
  auStack_448 = auVar100 << 0x20;
  while( true ) {
    pvVar33 = pvStack_460;
    uVar78 = (ulong)(int)auStack_470._8_4_;
    if ((long)uVar78 <= lVar61) break;
    pIVar68 = IStack_3e8.Data + *(int *)((long)pvStack_460 + lVar61 * 0x110 + 0xe0);
    ImBitVector::Create((ImBitVector *)((long)pvStack_460 + lVar61 * 0x110 + 0xf0),
                        *(int *)((long)pvStack_460 + lVar61 * 0x110 + 0xe4) + 1);
    uStack_488 = pIVar68;
    if ((pIVar68->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(&pIVar68->GlyphsSet,pIVar68->GlyphsHighest + 1);
    }
    psVar83 = (stbtt_fontinfo *)((long)pvVar33 + lVar61 * 0x110);
    pIVar68 = uStack_488;
    for (puVar44 = *(ushort **)&psVar83[1].indexToLocFormat;
        (uVar65 = (uint)*puVar44, *puVar44 != 0 && (uVar51 = puVar44[1], uVar51 != 0));
        puVar44 = puVar44 + 2) {
      for (; uVar65 <= uVar51; uVar65 = uVar65 + 1) {
        puVar12 = (pIVar68->GlyphsSet).Storage.Data;
        uVar66 = 1 << ((byte)uVar65 & 0x1f);
        if (((puVar12[uVar65 >> 5] >> (uVar65 & 0x1f) & 1) == 0) &&
           (iVar41 = stbtt_FindGlyphIndex(psVar83,uVar65), pIVar68 = uStack_488, iVar41 != 0)) {
          piVar64 = &psVar83[1].cff.cursor;
          *piVar64 = *piVar64 + 1;
          uStack_488->GlyphsCount = uStack_488->GlyphsCount + 1;
          uVar78 = (ulong)((uVar65 >> 5) << 2);
          puVar1 = (uint *)(*(long *)&psVar83[1].charstrings.cursor + uVar78);
          *puVar1 = *puVar1 | uVar66;
          puVar12 = (uint *)((long)puVar12 + uVar78);
          *puVar12 = *puVar12 | uVar66;
          auStack_448._0_4_ = auStack_448._0_4_ + 1;
        }
      }
    }
    lVar61 = lVar61 + 1;
  }
  for (lVar61 = 0; pvVar33 = pvStack_460, pIVar79 = pIStack_478, lVar61 < (int)uVar78;
      lVar61 = lVar61 + 1) {
    this_00 = (ImVector<int> *)((long)pvStack_460 + lVar61 * 0x110 + 0x100);
    ImVector<int>::reserve(this_00,*(int *)((long)pvStack_460 + lVar61 * 0x110 + 0xe8));
    pIVar68 = *(ImFontBuildDstData **)((long)pvVar33 + lVar61 * 0x110 + 0xf8);
    uStack_488 = (ImFontBuildDstData *)
                 (&pIVar68->SrcCount + *(int *)((long)pvVar33 + lVar61 * 0x110 + 0xf0));
    iVar41 = 0;
    for (; pIVar68 < uStack_488; pIVar68 = (ImFontBuildDstData *)&pIVar68->GlyphsHighest) {
      uVar65 = pIVar68->SrcCount;
      if (uVar65 != 0) {
        for (uVar66 = 0; uVar66 != 0x20; uVar66 = uVar66 + 1) {
          if ((uVar65 >> (uVar66 & 0x1f) & 1) != 0) {
            asStack_238[0].data._0_4_ = iVar41 + uVar66;
            ImVector<int>::push_back(this_00,(int *)asStack_238);
          }
        }
      }
      iVar41 = iVar41 + 0x20;
    }
    ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)((long)pvVar33 + lVar61 * 0x110 + 0xf0))
    ;
    uVar78 = auStack_470._8_8_ & 0xffffffff;
  }
  lVar61 = 0x10;
  for (lVar81 = 0; lVar81 < IStack_3e8.Size; lVar81 = lVar81 + 1) {
    ImVector<unsigned_int>::clear
              ((ImVector<unsigned_int> *)((long)&(IStack_3e8.Data)->SrcCount + lVar61));
    lVar61 = lVar61 + 0x20;
  }
  ImVector<ImFontBuildDstData>::clear(&IStack_3e8);
  IStack_418 = (ImVector<stbrp_rect>)ZEXT816(0);
  IStack_3d8.Size = 0;
  IStack_3d8.Capacity = 0;
  IStack_3d8.Data = (stbtt_packedchar *)0x0;
  uVar96 = auStack_448._0_4_;
  ImVector<stbrp_rect>::resize(&IStack_418,auStack_448._0_4_);
  ImVector<stbtt_packedchar>::resize(&IStack_3d8,uVar96);
  uVar78 = 0;
  memset(IStack_418.Data,0,(long)IStack_418.Size << 4);
  memset(IStack_3d8.Data,0,(long)IStack_3d8.Size * 0x1c);
  iVar43 = 0;
  iVar41 = 0;
  auVar17._12_4_ = 0;
  auVar17._0_12_ = auStack_448._4_12_;
  auStack_448 = auVar17 << 0x20;
  while( true ) {
    uVar98 = 0x80000000;
    uVar97 = 0x80000000;
    uVar96 = 0x80000000;
    if ((long)(int)auStack_470._8_4_ <= (long)uVar78) break;
    iVar80 = *(int *)((long)pvStack_460 + uVar78 * 0x110 + 0xe8);
    uVar69 = uVar78;
    if (iVar80 != 0) {
      psVar83 = (stbtt_fontinfo *)((long)pvStack_460 + uVar78 * 0x110);
      *(stbrp_rect **)&psVar83[1].hmtx = IStack_418.Data + iVar41;
      *(stbtt_packedchar **)&psVar83[1].gpos = IStack_3d8.Data + iVar43;
      pIVar75 = (pIVar79->ConfigData).Data;
      fVar86 = pIVar75[uVar78].SizePixels;
      *(float *)&psVar83[1].userdata = fVar86;
      *(undefined4 *)((long)&psVar83[1].userdata + 4) = 0;
      psVar83[1].data = *(uchar **)&psVar83[1].gsubrs.cursor;
      iVar42 = *(int *)&psVar83[1].gsubrs.data;
      psVar83[1].fontstart = iVar42;
      *(stbtt_packedchar **)&psVar83[1].loca = IStack_3d8.Data + iVar43;
      *(char *)&psVar83[1].glyf = (char)pIVar75[uVar78].OversampleH;
      *(char *)((long)&psVar83[1].glyf + 1) = (char)pIVar75[uVar78].OversampleV;
      uStack_490 = uVar78;
      if (fVar86 <= 0.0) {
        fVar86 = -fVar86 / (float)(ushort)(*(ushort *)(psVar83->data + (long)psVar83->head + 0x12)
                                           << 8 | *(ushort *)
                                                   (psVar83->data + (long)psVar83->head + 0x12) >> 8
                                          );
      }
      else {
        fVar86 = stbtt_ScaleForPixelHeight(psVar83,fVar86);
        uVar96 = extraout_XMM0_Db;
        uVar97 = extraout_XMM0_Dc;
        uVar98 = extraout_XMM0_Dd;
      }
      uStack_488 = (ImFontBuildDstData *)CONCAT44(uVar96,fVar86);
      iVar41 = iVar41 + iVar80;
      iVar43 = iVar43 + iVar80;
      iVar80 = pIVar79->TexGlyphPadding;
      lVar61 = 6;
      uStack_480 = uVar97;
      uStack_47c = uVar98;
      for (lVar81 = 0; pIVar79 = pIStack_478, uVar69 = uStack_490, lVar81 < iVar42;
          lVar81 = lVar81 + 1) {
        iVar42 = stbtt_FindGlyphIndex
                           (psVar83,*(int *)(*(long *)&psVar83[1].gsubrs.cursor + lVar81 * 4));
        stbtt_GetGlyphBitmapBoxSubpixel
                  (psVar83,iVar42,(float)pIVar75[uVar78].OversampleH * (float)uStack_488,
                   (float)pIVar75[uVar78].OversampleV * (float)uStack_488,(float)uStack_488,
                   in_XMM3_Da,(int *)asStack_238,(int *)auStack_470,(int *)&uStack_428,
                   (int *)&sStack_494);
        uVar65 = (pIVar75[uVar78].OversampleH +
                 (((uint)uStack_428 + iVar80) - (int)asStack_238[0].data)) - 1;
        lVar54 = *(long *)&psVar83[1].hmtx;
        *(short *)(lVar54 + lVar61 + -2) = (short)uVar65;
        uVar66 = (pIVar75[uVar78].OversampleV + ((sStack_494 + iVar80) - auStack_470._0_4_)) - 1;
        *(short *)(lVar54 + lVar61) = (short)uVar66;
        auStack_448._0_4_ = auStack_448._0_4_ + (uVar66 & 0xffff) * (uVar65 & 0xffff);
        iVar42 = *(int *)&psVar83[1].gsubrs.data;
        lVar61 = lVar61 + 0x10;
      }
    }
    uVar78 = uVar69 + 1;
  }
  pIVar79->TexHeight = 0;
  iStack_498 = pIVar79->TexDesiredWidth;
  if (iStack_498 < 1) {
    iVar41 = (int)SQRT((float)(int)auStack_448._0_4_);
    iStack_498 = 0x1000;
    if ((iVar41 < 0xb33) && (iStack_498 = 0x800, iVar41 < 0x599)) {
      iStack_498 = (uint)(0x2cb < iVar41) * 0x200 + 0x200;
    }
  }
  pIVar79->TexWidth = iStack_498;
  uStack_49c = pIVar79->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar41 = iStack_498 - uStack_49c;
  ptr_00 = (stbrp_node *)ImGui::MemAlloc((long)iVar41 << 4);
  if ((ptr == (stbrp_context *)0x0) || (ptr_00 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (ptr_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    ptr_00 = (stbrp_node *)0x0;
    uStack_49c = 0;
    iStack_498 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar65 = iVar41 - 1;
    uVar69 = 0;
    psVar15 = ptr_00;
    uVar78 = uVar69;
    if (0 < (int)uVar65) {
      uVar69 = (ulong)uVar65;
      uVar78 = uVar69;
    }
    while( true ) {
      bVar34 = uVar69 == 0;
      uVar69 = uVar69 - 1;
      if (bVar34) break;
      psVar15->next = psVar15 + 1;
      psVar15 = psVar15 + 1;
    }
    ptr_00[uVar78].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = ptr_00;
    ptr->active_head = ptr->extra;
    ptr->width = iVar41;
    ptr->height = 0x8000 - uStack_49c;
    ptr->num_nodes = iVar41;
    ptr->align = (int)(uVar65 + iVar41) / iVar41;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar41;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  psStack_358 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar79,ptr);
  for (lVar61 = 0; pvVar33 = pvStack_460, lVar61 < (int)auStack_470._8_4_; lVar61 = lVar61 + 1) {
    iVar41 = *(int *)((long)pvStack_460 + lVar61 * 0x110 + 0xe8);
    if (iVar41 != 0) {
      stbrp_pack_rects(psStack_358,*(stbrp_rect **)((long)pvStack_460 + lVar61 * 0x110 + 200),iVar41
                      );
      uVar65 = *(uint *)((long)pvVar33 + lVar61 * 0x110 + 0xe8);
      if ((int)uVar65 < 1) {
        uVar65 = 0;
      }
      for (lVar81 = 0; (ulong)uVar65 * 0x10 != lVar81; lVar81 = lVar81 + 0x10) {
        lVar54 = *(long *)((long)pvVar33 + lVar61 * 0x110 + 200);
        if (*(int *)(lVar54 + 0xc + lVar81) != 0) {
          iVar41 = (uint)*(ushort *)(lVar54 + 6 + lVar81) + (uint)*(ushort *)(lVar54 + 10 + lVar81);
          if (iVar41 < pIVar79->TexHeight) {
            iVar41 = pIVar79->TexHeight;
          }
          pIVar79->TexHeight = iVar41;
        }
      }
    }
  }
  uVar65 = pIVar79->TexHeight;
  if ((pIVar79->Flags & 1) == 0) {
    uVar65 = (int)(uVar65 - 1) >> 1 | uVar65 - 1;
    uVar65 = (int)uVar65 >> 2 | uVar65;
    uVar65 = (int)uVar65 >> 4 | uVar65;
    uVar65 = (int)uVar65 >> 8 | uVar65;
    uVar65 = (int)uVar65 >> 0x10 | uVar65;
  }
  iVar41 = uVar65 + 1;
  pIVar79->TexHeight = iVar41;
  auVar88._0_4_ = (float)pIVar79->TexWidth;
  auVar88._4_4_ = (float)iVar41;
  auVar88._8_8_ = 0;
  auVar100 = divps(_DAT_00155e50,auVar88);
  pIVar79->TexUvScale = auVar100._0_8_;
  puVar45 = (uchar *)ImGui::MemAlloc((long)(iVar41 * pIVar79->TexWidth));
  pIVar79->TexPixelsAlpha8 = puVar45;
  lVar61 = 0;
  memset(puVar45,0,(long)pIVar79->TexHeight * (long)pIVar79->TexWidth);
  puStack_390 = pIVar79->TexPixelsAlpha8;
  lVar81 = (long)iStack_498;
  auStack_278 = pshuflw(ZEXT416(uStack_49c),ZEXT416(uStack_49c),0);
  puStack_2e8 = puStack_390 + 1;
  auVar100 = ZEXT816(0);
  psStack_348 = ptr_00;
  while (lVar61 < (int)auStack_470._8_4_) {
    lStack_350 = lVar61;
    if (*(int *)((long)pvStack_460 + lVar61 * 0x110 + 0xe8) != 0) {
      pIStack_2f8 = (pIStack_478->ConfigData).Data;
      psVar83 = (stbtt_fontinfo *)((long)pvStack_460 + lVar61 * 0x110);
      lVar61._0_4_ = psVar83[1].hmtx;
      lVar61._4_4_ = psVar83[1].kern;
      bVar34 = true;
      lVar54 = 0;
      psStack_388 = psVar83;
      lStack_2e0 = lVar61;
      while( true ) {
        uVar98 = 0x80000000;
        uVar97 = 0x80000000;
        uVar96 = 0x80000000;
        if (!bVar34) break;
        fVar86 = *(float *)&psVar83[1].userdata;
        if (fVar86 <= 0.0) {
          fStack_248 = -fVar86 / (float)(ushort)(*(ushort *)
                                                  (psVar83->data + (long)psVar83->head + 0x12) << 8
                                                | *(ushort *)
                                                   (psVar83->data + (long)psVar83->head + 0x12) >> 8
                                                );
        }
        else {
          fStack_248 = stbtt_ScaleForPixelHeight(psVar83,fVar86);
          auVar100 = ZEXT816(0);
          uVar96 = extraout_var_00._0_4_;
          uVar97 = extraout_var_00._4_4_;
          uVar98 = extraout_var_00._8_4_;
        }
        uVar78._0_4_ = psVar83[1].glyf;
        uVar78._4_4_ = psVar83[1].hhea;
        auVar25._8_6_ = 0;
        auVar25._0_8_ = uVar78;
        auVar25[0xe] = (char)((uint)uVar78._4_4_ >> 0x18);
        auVar27._8_4_ = 0;
        auVar27._0_8_ = uVar78;
        auVar27[0xc] = (char)((uint)uVar78._4_4_ >> 0x10);
        auVar27._13_2_ = auVar25._13_2_;
        auVar28._8_4_ = 0;
        auVar28._0_8_ = uVar78;
        auVar28._12_3_ = auVar27._12_3_;
        auVar29._8_2_ = 0;
        auVar29._0_8_ = uVar78;
        auVar29[10] = (char)((uint)uVar78._4_4_ >> 8);
        auVar29._11_4_ = auVar28._11_4_;
        auVar30._8_2_ = 0;
        auVar30._0_8_ = uVar78;
        auVar30._10_5_ = auVar29._10_5_;
        auVar31[8] = (char)uVar78._4_4_;
        auVar31._0_8_ = uVar78;
        auVar31._9_6_ = auVar30._9_6_;
        cVar95 = (char)((uint)(undefined4)uVar78 >> 0x18);
        Var19 = CONCAT91((unkuint9)auVar31._8_7_ << 8,cVar95);
        auVar24[10] = 0;
        auVar24._0_10_ = Var19;
        cVar94 = (char)((uint)(undefined4)uVar78 >> 0x10);
        auVar90[4] = cVar94;
        auVar90._0_4_ = (undefined4)uVar78;
        auVar90._5_11_ = auVar24 << 8;
        auVar23[0xc] = 0;
        auVar23._0_12_ = auVar90._4_12_;
        cVar93 = (char)((uint)(undefined4)uVar78 >> 8);
        auVar18._1_13_ = auVar23 << 8;
        auVar18[0] = cVar93;
        bVar85 = (byte)(undefined4)uVar78;
        auVar89._0_2_ = CONCAT11(0,bVar85);
        auVar89._2_14_ = auVar18;
        auStack_448._0_2_ = auVar18._0_2_;
        sVar8 = -auVar90._4_2_;
        uVar51 = (ushort)Var19;
        sVar9 = -uVar51;
        auStack_448._2_6_ = 0;
        auVar26._10_2_ = 0;
        auVar26._0_10_ = auVar89._0_10_;
        auVar26._12_2_ = uVar51;
        uVar32 = CONCAT42(auVar26._10_4_,auVar90._4_2_);
        auVar20._2_10_ = (unkuint10)uVar32 << 0x10;
        auVar20._0_2_ = auStack_448._0_2_;
        auVar91._0_4_ = (float)auVar89._0_2_;
        auVar91._4_4_ = (float)auVar20._0_4_;
        auVar91._8_4_ = (float)(int)uVar32;
        auVar91._12_4_ = (float)uVar51;
        auStack_268 = divps(_DAT_00155e50,auVar91);
        auVar107[0] = -(bVar85 == 0);
        auVar107[1] = -(bVar85 == 0);
        auVar107[2] = -(bVar85 == 0);
        auVar107[3] = -(bVar85 == 0);
        auVar107[4] = -(cVar93 == '\0');
        auVar107[5] = -(cVar93 == '\0');
        auVar107[6] = -(cVar93 == '\0');
        auVar107[7] = -(cVar93 == '\0');
        auVar107[8] = -(cVar94 == auVar100[8]);
        auVar107[9] = -(cVar94 == auVar100[9]);
        auVar107[10] = -(cVar94 == auVar100[10]);
        auVar107[0xb] = -(cVar94 == auVar100[0xb]);
        auVar107[0xc] = -(cVar95 == auVar100[0xc]);
        auVar107[0xd] = -(cVar95 == auVar100[0xd]);
        auVar107[0xe] = -(cVar95 == auVar100[0xe]);
        auVar107[0xf] = -(cVar95 == auVar100[0xf]);
        Var22 = CONCAT64(CONCAT42(CONCAT22(sVar9,sVar9),sVar8),CONCAT22(sVar8,sVar9));
        auVar21._4_8_ = (long)((unkuint10)Var22 >> 0x10);
        auVar21._2_2_ = 1 - auStack_448._0_2_;
        auVar21._0_2_ = 1 - auStack_448._0_2_;
        auVar101._0_4_ = (float)(int)(short)(1 - auVar89._0_2_);
        auVar101._4_4_ = (float)(auVar21._0_4_ >> 0x10);
        auVar101._8_4_ = (float)((int)((unkuint10)Var22 >> 0x10) >> 0x10);
        auVar101._12_4_ = (float)(int)sVar9;
        fVar86 = fStack_248 * auVar91._0_4_;
        fStack_2a8 = fStack_248 * auVar91._4_4_;
        fStack_290 = fStack_248 * auVar91._8_4_;
        fStack_28c = fStack_248 * auVar91._12_4_;
        auVar92._0_4_ = auVar91._0_4_ + auVar91._0_4_;
        auVar92._4_4_ = auVar91._4_4_ + auVar91._4_4_;
        auVar92._8_4_ = auVar91._8_4_ + auVar91._8_4_;
        auVar92._12_4_ = auVar91._12_4_ + auVar91._12_4_;
        auStack_258 = divps(auVar101,auVar92);
        auStack_258 = ~auVar107 & auStack_258;
        lVar54 = (long)(int)lVar54;
        fVar87 = fStack_2a8;
        if (fVar86 <= fStack_2a8) {
          fVar87 = fVar86;
        }
        fStack_3ec = (0.35 / fVar87) * (0.35 / fVar87);
        fStack_284 = -fStack_2a8;
        uStack_310 = uVar78 & 0xff;
        uStack_318 = (ulong)((uint)(uVar78 >> 8) & 0xff);
        uStack_488 = (ImFontBuildDstData *)(ulong)((undefined4)uVar78 & 0xff);
        lVar59 = 0;
        fStack_2a4 = fStack_2a8;
        fStack_2a0 = fStack_2a8;
        fStack_29c = fStack_2a8;
        fStack_298 = fVar86;
        fStack_294 = fStack_2a8;
        fStack_288 = fVar86;
        fStack_280 = fVar86;
        fStack_27c = fStack_284;
        uStack_244 = uVar96;
        uStack_240 = uVar97;
        uStack_23c = uVar98;
LAB_0012b749:
        if (lVar59 < psVar83[1].fontstart) {
          if (*(int *)(lVar61 + lVar54 * 0x10 + 0xc) != 0) {
            lVar46 = lVar61 + lVar54 * 0x10;
            sVar8 = *(short *)(lVar46 + 4);
            if ((sVar8 == 0) || (sVar9 = *(short *)(lVar46 + 6), sVar9 == 0)) goto LAB_0012ccb6;
            if (psVar83[1].data == (uchar *)0x0) {
              iVar41 = *(int *)((long)&psVar83[1].userdata + 4) + (int)lVar59;
            }
            else {
              iVar41 = *(int *)(psVar83[1].data + lVar59 * 4);
            }
            puStack_338 = (uint *)(*(long *)&psVar83[1].loca + lVar59 * 0x1c);
            lStack_3b8 = lVar46;
            lStack_330 = lVar59;
            lStack_328 = lVar54;
            iVar43 = stbtt_FindGlyphIndex(psVar83,iVar41);
            lVar59 = lStack_3b8;
            fVar87 = auVar100._0_4_;
            *(uint *)(lStack_3b8 + 8) =
                 CONCAT22((short)((uint)*(undefined4 *)(lStack_3b8 + 8) >> 0x10) + auStack_278._2_2_
                          ,(short)*(undefined4 *)(lStack_3b8 + 8) + auStack_278._0_2_);
            *(short *)(lStack_3b8 + 4) = sVar8 - (short)uStack_49c;
            *(short *)(lStack_3b8 + 6) = sVar9 - (short)uStack_49c;
            puVar45 = psVar83->data;
            uVar51 = *(ushort *)(puVar45 + (long)psVar83->hhea + 0x22) << 8 |
                     *(ushort *)(puVar45 + (long)psVar83->hhea + 0x22) >> 8;
            iVar41 = psVar83->hmtx;
            lVar61 = (ulong)uVar51 * 4 + (long)iVar41 + -4;
            lVar54 = (ulong)uVar51 * 4 + (long)iVar41 + -3;
            if (iVar43 < (int)(uint)uVar51) {
              lVar61 = (long)(iVar43 * 4) + (long)iVar41;
              lVar54 = (long)(iVar43 * 4) + 1 + (long)iVar41;
            }
            uStack_3f4 = (uint)puVar45[lVar61];
            uStack_3f8 = (uint)puVar45[lVar54];
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar83,iVar43,fStack_298,fStack_2a8,fVar86,fVar87,(int *)&fStack_360,
                       &iStack_364,&iStack_2ac,&iStack_2b0);
            uVar51 = *(ushort *)(lVar59 + 8);
            puStack_378 = (uchar *)(ulong)*(ushort *)(lVar59 + 10);
            uVar52 = *(ushort *)(lVar59 + 4);
            uVar10 = *(ushort *)(lVar59 + 6);
            uVar65 = stbtt_GetGlyphShape(psVar83,iVar43,(stbtt_vertex **)&uStack_428);
            fVar60 = (float)(((uint)uVar52 - (int)uStack_488) + 1);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psStack_388,iVar43,fStack_298,fStack_2a8,fVar86,fVar87,(int *)&sStack_494,
                       (int *)&uStack_35c,(int *)0x0,(int *)0x0);
            sVar40 = sStack_494;
            fStack_454 = fVar60;
            if ((fVar60 != 0.0) &&
               (uVar66 = ((uint)uVar10 - auStack_448._0_4_) + 1, uStack_380 = (ulong)uVar66,
               uVar66 != 0)) {
              puStack_378 = puStack_390 + (long)puStack_378 * lVar81 + (ulong)uVar51;
              iVar41 = (uint)uVar52 - (int)(float)uStack_488;
              lVar61 = CONCAT44(uStack_428._4_4_,(uint)uStack_428);
              uStack_340 = (ulong)uStack_35c;
              uVar69 = 0;
              uVar78 = (ulong)uVar65;
              if ((int)uVar65 < 1) {
                uVar78 = uVar69;
              }
              uVar56 = 0;
              for (; uVar78 * 0xe - uVar69 != 0; uVar69 = uVar69 + 0xe) {
                uVar56 = (ulong)((int)uVar56 + (uint)(*(char *)(lVar61 + 0xc + uVar69) == '\x01'));
              }
              if (((int)uVar56 != 0) &&
                 (uStack_490 = uVar56, pvStack_450 = ImGui::MemAlloc(uVar56 * 4),
                 pvStack_450 != (void *)0x0)) {
                psStack_430 = (stbtt__point *)0x0;
                iVar43 = 0;
                iVar42 = 0;
                iVar80 = 0;
                do {
                  ptr_01 = psStack_430;
                  if (iVar42 == 1) {
                    psStack_430 = (stbtt__point *)ImGui::MemAlloc((long)iVar80 << 3);
                    if (psStack_430 == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      ImGui::MemFree(pvStack_450);
                      break;
                    }
                  }
                  else if (iVar42 == 2) goto LAB_0012bbe9;
                  asStack_238[0].data._0_4_ = 0;
                  fVar86 = 0.0;
                  fVar87 = 0.0;
                  uVar65 = 0xffffffff;
                  for (lVar54 = 0; uVar78 * 0xe - lVar54 != 0; lVar54 = lVar54 + 0xe) {
                    iVar80 = (int)asStack_238[0].data;
                    switch(*(undefined1 *)(lVar61 + 0xc + lVar54)) {
                    case 1:
                      if (-1 < (int)uVar65) {
                        *(int *)((long)pvStack_450 + (ulong)uVar65 * 4) =
                             (int)asStack_238[0].data - iVar43;
                      }
                      uVar65 = uVar65 + 1;
                      auVar100 = pshuflw(ZEXT416(*(uint *)(lVar61 + lVar54)),
                                         ZEXT416(*(uint *)(lVar61 + lVar54)),0x60);
                      fVar86 = (float)(auVar100._0_4_ >> 0x10);
                      fVar87 = (float)(auVar100._4_4_ >> 0x10);
                      iVar43 = (int)asStack_238[0].data;
                      iVar80 = (int)asStack_238[0].data + 1;
                      if (psStack_430 != (stbtt__point *)0x0) {
                        psStack_430[(int)asStack_238[0].data].x = fVar86;
                        psStack_430[(int)asStack_238[0].data].y = fVar87;
                      }
                      break;
                    case 2:
                      auVar100 = pshuflw(ZEXT416(*(uint *)(lVar61 + lVar54)),
                                         ZEXT416(*(uint *)(lVar61 + lVar54)),0x60);
                      fVar86 = (float)(auVar100._0_4_ >> 0x10);
                      fVar87 = (float)(auVar100._4_4_ >> 0x10);
                      iVar80 = (int)asStack_238[0].data + 1;
                      if (psStack_430 != (stbtt__point *)0x0) {
                        psStack_430[(int)asStack_238[0].data].x = fVar86;
                        psStack_430[(int)asStack_238[0].data].y = fVar87;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (psStack_430,(int *)asStack_238,fVar86,fVar87,
                                 (float)(int)*(short *)(lVar61 + 4 + lVar54),
                                 (float)(int)*(short *)(lVar61 + 6 + lVar54),
                                 (float)(int)*(short *)(lVar61 + lVar54),
                                 (float)(int)*(short *)(lVar61 + 2 + lVar54),fStack_3ec,0);
                      goto LAB_0012bb6b;
                    case 4:
                      stbtt__tesselate_cubic
                                (psStack_430,(int *)asStack_238,fVar86,fVar87,
                                 (float)(int)*(short *)(lVar61 + 4 + lVar54),
                                 (float)(int)*(short *)(lVar61 + 6 + lVar54),
                                 (float)(int)*(short *)(lVar61 + 8 + lVar54),
                                 (float)(int)*(short *)(lVar61 + 10 + lVar54),
                                 (float)(int)*(short *)(lVar61 + lVar54),
                                 (float)(int)*(short *)(lVar61 + 2 + lVar54),fStack_3ec,0);
LAB_0012bb6b:
                      auVar100 = pshuflw(ZEXT416(*(uint *)(lVar61 + lVar54)),
                                         ZEXT416(*(uint *)(lVar61 + lVar54)),0x60);
                      fVar86 = (float)(auVar100._0_4_ >> 0x10);
                      fVar87 = (float)(auVar100._4_4_ >> 0x10);
                      iVar80 = (int)asStack_238[0].data;
                    }
                    asStack_238[0].data._0_4_ = iVar80;
                  }
                  *(int *)((long)pvStack_450 + (long)(int)uVar65 * 4) =
                       (int)asStack_238[0].data - iVar43;
                  iVar42 = iVar42 + 1;
                  iVar80 = (int)asStack_238[0].data;
                } while( true );
              }
            }
            goto LAB_0012c713;
          }
          goto LAB_0012ccb6;
        }
        bVar34 = false;
      }
      fVar86 = pIStack_2f8[lStack_350].RasterizerMultiply;
      if ((fVar86 != 1.0) || (NAN(fVar86))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)asStack_238,fVar86);
        piVar64 = (int *)(*(long *)&psVar83[1].hmtx + 0xc);
        for (iVar41 = 0; iVar41 < psVar83[1].cff.cursor; iVar41 = iVar41 + 1) {
          if (*piVar64 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)asStack_238,pIStack_478->TexPixelsAlpha8,
                       (uint)*(ushort *)(piVar64 + -1),(uint)*(ushort *)((long)piVar64 + -2),
                       (uint)*(ushort *)(piVar64 + -2),(uint)*(ushort *)((long)piVar64 + -6),
                       pIStack_478->TexWidth);
          }
          piVar64 = piVar64 + 4;
        }
        auVar100 = ZEXT816(0);
      }
      psVar83[1].hmtx = 0;
      psVar83[1].kern = 0;
    }
    lVar61 = lStack_350 + 1;
  }
  ImGui::MemFree(ptr_00);
  ImGui::MemFree(psStack_358);
  ImVector<stbrp_rect>::clear(&IStack_418);
  lVar61 = 0;
  while( true ) {
    pIVar79 = pIStack_478;
    uVar78 = (ulong)(int)auStack_470._8_4_;
    if ((long)uVar78 <= lVar61) break;
    if (*(int *)((long)pvStack_460 + lVar61 * 0x110 + 0xe8) != 0) {
      psVar83 = (stbtt_fontinfo *)((long)pvStack_460 + lVar61 * 0x110);
      pIVar75 = (pIStack_478->ConfigData).Data;
      font = pIVar75[lVar61].DstFont;
      fVar86 = stbtt_ScaleForPixelHeight(psVar83,pIVar75[lVar61].SizePixels);
      uVar51 = *(ushort *)(psVar83->data + (long)psVar83->hhea + 4);
      uVar51 = uVar51 << 8 | uVar51 >> 8;
      fVar87 = -1.0;
      if (0 < (short)uVar51) {
        fVar87 = 1.0;
      }
      uVar52 = *(ushort *)(psVar83->data + (long)psVar83->hhea + 6);
      uVar52 = uVar52 << 8 | uVar52 >> 8;
      fVar60 = -1.0;
      if (0 < (short)uVar52) {
        fVar60 = 1.0;
      }
      pIVar75 = pIVar75 + lVar61;
      ImFontAtlasBuildSetupFont
                (pIStack_478,font,pIVar75,(float)(int)((float)(int)(short)uVar51 * fVar86 + fVar87),
                 (float)(int)((float)(int)(short)uVar52 * fVar86 + fVar60));
      uStack_488 = (ImFontBuildDstData *)CONCAT44(uStack_488._4_4_,(pIVar75->GlyphOffset).x);
      auStack_448 = ZEXT416((uint)((float)(int)(font->Ascent + 0.5) + (pIVar75->GlyphOffset).y));
      lVar54 = 0;
      for (lVar81 = 0; lVar81 < psVar83[1].cff.cursor; lVar81 = lVar81 + 1) {
        lVar59 = *(long *)&psVar83[1].gpos;
        fVar87 = 1.0 / (float)pIStack_478->TexHeight;
        fVar86 = 1.0 / (float)pIStack_478->TexWidth;
        ImFont::AddGlyph(font,pIVar75,*(ImWchar *)(*(long *)&psVar83[1].gsubrs.cursor + lVar81 * 4),
                         *(float *)(lVar59 + 8 + lVar54) + 0.0 + (float)uStack_488,
                         *(float *)(lVar59 + 0xc + lVar54) + 0.0 + (float)auStack_448._0_4_,
                         *(float *)(lVar59 + 0x14 + lVar54) + 0.0 + (float)uStack_488,
                         *(float *)(lVar59 + 0x18 + lVar54) + 0.0 + (float)auStack_448._0_4_,
                         (float)*(ushort *)(lVar59 + lVar54) * fVar86,
                         (float)*(ushort *)(lVar59 + 2 + lVar54) * fVar87,
                         (float)*(ushort *)(lVar59 + 4 + lVar54) * fVar86,
                         (float)*(ushort *)(lVar59 + 6 + lVar54) * fVar87,
                         *(float *)(lVar59 + 0x10 + lVar54));
        lVar54 = lVar54 + 0x1c;
      }
    }
    lVar61 = lVar61 + 1;
  }
  lVar61 = 0;
  for (lVar81 = 0; lVar81 < (int)uVar78; lVar81 = lVar81 + 1) {
    ImFontBuildSrcData::~ImFontBuildSrcData((ImFontBuildSrcData *)((long)pvStack_460 + lVar61));
    uVar78 = auStack_470._8_8_ & 0xffffffff;
    lVar61 = lVar61 + 0x110;
  }
  ImFontAtlasBuildFinish(pIVar79);
  ImVector<stbtt_packedchar>::~ImVector(&IStack_3d8);
  ImVector<stbrp_rect>::~ImVector(&IStack_418);
  lVar81 = lStack_3c0;
LAB_0012d001:
  bVar34 = lStack_2f0 <= lVar81;
  ImVector<ImFontBuildDstData>::~ImVector(&IStack_3e8);
  ImVector<ImFontBuildSrcData>::~ImVector((ImVector<ImFontBuildSrcData> *)(auStack_470 + 8));
  return bVar34;
LAB_0012bbe9:
  if (psStack_430 != (stbtt__point *)0x0) {
    iVar43 = 0;
    for (uVar78 = 0; uStack_490 != uVar78; uVar78 = uVar78 + 1) {
      iVar43 = iVar43 + *(int *)((long)pvStack_450 + uVar78 * 4);
    }
    psVar47 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar43 + 1) * 0x14);
    psStack_438 = psVar47;
    if (psVar47 != (stbtt__edge *)0x0) {
      iVar43 = 0;
      iVar80 = 0;
      for (uVar78 = 0; uVar78 != uStack_490; uVar78 = uVar78 + 1) {
        iVar42 = *(int *)((long)pvStack_450 + uVar78 * 4);
        uVar56 = (ulong)(iVar42 - 1);
        iVar77 = iVar42;
        for (uVar69 = 0; iVar76 = (int)uVar56, (long)uVar69 < (long)iVar77; uVar69 = uVar69 + 1) {
          fVar86 = ptr_01[(long)iVar43 + (long)iVar76].y;
          fVar87 = ptr_01[(long)iVar43 + uVar69].y;
          if ((fVar86 != fVar87) || (NAN(fVar86) || NAN(fVar87))) {
            iVar77 = (int)uVar69;
            if (fVar86 <= fVar87) {
              iVar77 = iVar76;
              iVar76 = (int)uVar69;
            }
            psVar47[iVar80].invert = (uint)(fVar87 < fVar86);
            sVar3 = ptr_01[(long)iVar43 + (long)iVar76];
            sVar4 = ptr_01[(long)iVar43 + (long)iVar77];
            psVar70 = psVar47 + iVar80;
            psVar70->x0 = sVar3.x * fStack_288 + 0.0;
            psVar70->y0 = sVar3.y * fStack_284 + 0.0;
            psVar70->x1 = sVar4.x * fStack_280 + 0.0;
            psVar70->y1 = sVar4.y * fStack_27c + 0.0;
            iVar80 = iVar80 + 1;
            iVar77 = *(int *)((long)pvStack_450 + uVar78 * 4);
          }
          uVar56 = uVar69 & 0xffffffff;
        }
        iVar43 = iVar42 + iVar43;
      }
      stbtt__sort_edges_quicksort(psVar47,iVar80);
      for (uVar78 = 1; (long)uVar78 < (long)iVar80; uVar78 = uVar78 + 1) {
        uVar2 = psStack_438[uVar78].x0;
        uVar5 = psStack_438[uVar78].y0;
        asStack_238[0].cursor = psStack_438[uVar78].invert;
        uVar11 = psStack_438[uVar78].x1;
        uVar14 = psStack_438[uVar78].y1;
        psVar70 = psVar47;
        for (uVar69 = uVar78; 0 < (long)uVar69; uVar69 = uVar69 - 1) {
          if (psVar70->y0 <= (float)uVar5) goto LAB_0012bd99;
          psVar70[1].invert = psVar70->invert;
          fVar86 = psVar70->y0;
          fVar87 = psVar70->x1;
          fVar60 = psVar70->y1;
          psVar70[1].x0 = psVar70->x0;
          psVar70[1].y0 = fVar86;
          psVar70[1].x1 = fVar87;
          psVar70[1].y1 = fVar60;
          psVar70 = psVar70 + -1;
        }
        uVar69 = 0;
LAB_0012bd99:
        iVar43 = (int)uVar69;
        if (uVar78 != (uVar69 & 0xffffffff)) {
          psStack_438[iVar43].x0 = (float)uVar2;
          psStack_438[iVar43].y0 = (float)uVar5;
          psStack_438[iVar43].x1 = (float)uVar11;
          psStack_438[iVar43].y1 = (float)uVar14;
          psStack_438[iVar43].invert = asStack_238[0].cursor;
        }
        psVar47 = psVar47 + 1;
        asStack_238[0].data._0_4_ = uVar11;
        asStack_238[0].data._4_4_ = uVar14;
      }
      auStack_470._0_8_ = (stbtt__active_edge *)0x0;
      scanline = asStack_238;
      if (0x3f < iVar41) {
        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)(uint)fStack_454 * 8 + 4);
      }
      lStack_2d0 = (long)(int)fStack_454;
      pfStack_400 = (float *)((long)&scanline->data + lStack_2d0 * 4);
      iVar43 = (int)uStack_380;
      fStack_36c = (float)(int)sVar40;
      psStack_438[iVar80].y0 = (float)((int)uStack_340 + iVar43) + 1.0;
      sStack_2c0 = lStack_2d0 * 4;
      sStack_2c8 = (long)iVar41 * 4 + 8;
      fStack_41c = (float)(int)fStack_454;
      uVar78 = 0;
      if ((int)fStack_454 < 1) {
        fStack_454 = 0.0;
      }
      lStack_2d8 = 0;
      if (0 < lStack_2d0) {
        lStack_2d8 = lStack_2d0;
      }
      uStack_380 = uStack_380 & 0xffffffff;
      if (iVar43 < 1) {
        uStack_380 = uVar78;
      }
      psVar49 = (stbtt__active_edge *)0x0;
      iStack_420 = 0;
      puStack_3b0 = (undefined8 *)0x0;
      uVar69 = uStack_340 & 0xffffffff;
      psStack_320 = psStack_438;
      iVar41 = 0;
      while (puVar48 = puStack_3b0, iVar41 != (int)uStack_380) {
        iStack_370 = (int)uVar69;
        fVar86 = (float)iStack_370;
        iStack_3f0 = iVar41;
        memset(scanline,0,sStack_2c0);
        memset(pfStack_400,0,sStack_2c8);
        psVar67 = (stbtt__active_edge *)auStack_470;
        while (psVar57 = psVar67, psVar62 = psVar57->next, psVar62 != (stbtt__active_edge *)0x0) {
          psVar67 = psVar62;
          if (psVar62->ey <= fVar86) {
            psVar57->next = psVar62->next;
            psVar62->direction = 0.0;
            psVar62->next = psVar49;
            psVar67 = psVar57;
            psVar49 = psVar62;
          }
        }
        uStack_2b8 = uVar78;
        bVar34 = (int)uStack_340 != 0;
        fVar87 = fVar86 + 1.0;
        bVar84 = iStack_3f0 == 0;
        for (psVar47 = psStack_320; fVar60 = psVar47->y0, fVar60 <= fVar87; psVar47 = psVar47 + 1) {
          fVar102 = psVar47->y1;
          if ((fVar60 != fVar102) || (NAN(fVar60) || NAN(fVar102))) {
            if (psVar49 == (stbtt__active_edge *)0x0) {
              if (iStack_420 == 0) {
                puVar48 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar48 == (undefined8 *)0x0) {
                  psVar49 = (stbtt__active_edge *)0x0;
                  iStack_420 = 0;
                  goto LAB_0012c0e6;
                }
                *puVar48 = puStack_3b0;
                fVar60 = psVar47->y0;
                fVar102 = psVar47->y1;
                iStack_420 = 799;
              }
              else {
                iStack_420 = iStack_420 + -1;
                puVar48 = puStack_3b0;
              }
              puStack_3b0 = puVar48;
              psVar62 = (stbtt__active_edge *)(puVar48 + (long)iStack_420 * 4 + 1);
              psVar67 = (stbtt__active_edge *)0x0;
            }
            else {
              psVar67 = psVar49->next;
              psVar62 = psVar49;
            }
            psVar49 = psVar67;
            fVar99 = psVar47->x0;
            fVar103 = (psVar47->x1 - fVar99) / (fVar102 - fVar60);
            psVar62->fdx = fVar103;
            psVar62->fdy = (float)(-(uint)(fVar103 != 0.0) & (uint)(1.0 / fVar103));
            psVar62->fx = ((fVar86 - fVar60) * fVar103 + fVar99) - fStack_36c;
            psVar62->direction = *(float *)(&DAT_00156954 + (ulong)(psVar47->invert == 0) * 4);
            psVar62->sy = fVar60;
            psVar62->ey = fVar102;
            psVar62->next = (stbtt__active_edge *)0x0;
            if (fVar102 < fVar86 && (bVar84 && bVar34)) {
              psVar62->ey = fVar86;
            }
            psVar62->next = (stbtt__active_edge *)auStack_470._0_8_;
            auStack_470._0_8_ = psVar62;
          }
LAB_0012c0e6:
        }
        psStack_320 = psVar47;
        psVar67 = (stbtt__active_edge *)auStack_470._0_8_;
        if ((stbtt__active_edge *)auStack_470._0_8_ != (stbtt__active_edge *)0x0) {
          for (; psVar67 != (stbtt__active_edge *)0x0; psVar67 = psVar67->next) {
            fVar60 = psVar67->fx;
            fVar102 = psVar67->fdx;
            if ((fVar102 != 0.0) || (NAN(fVar102))) {
              fVar109 = fVar102 + fVar60;
              fVar99 = psVar67->sy;
              fVar103 = (float)(~-(uint)(fVar86 < fVar99) & (uint)fVar60 |
                               (uint)((fVar99 - fVar86) * fVar102 + fVar60) &
                               -(uint)(fVar86 < fVar99));
              if (0.0 <= fVar103) {
                fVar104 = psVar67->ey;
                fVar108 = (float)(-(uint)(fVar104 < fVar87) &
                                  (uint)((fVar104 - fVar86) * fVar102 + fVar60) |
                                 ~-(uint)(fVar104 < fVar87) & (uint)fVar109);
                if (((0.0 <= fVar108) && (fVar103 < fStack_41c)) && (fVar108 < fStack_41c)) {
                  if (fVar99 <= fVar86) {
                    fVar99 = fVar86;
                  }
                  iVar41 = (int)fVar103;
                  if (fVar87 <= fVar104) {
                    fVar104 = fVar87;
                  }
                  iVar43 = (int)fVar108;
                  if (iVar41 == iVar43) {
                    lVar61 = (long)iVar41;
                    *(float *)((long)&scanline->data + lVar61 * 4) =
                         (((fVar108 - (float)iVar41) + (fVar103 - (float)iVar41)) * -0.5 + 1.0) *
                         psVar67->direction * (fVar104 - fVar99) +
                         *(float *)((long)&scanline->data + lVar61 * 4);
                    fVar60 = (fVar104 - fVar99) * psVar67->direction;
                  }
                  else {
                    fVar102 = psVar67->fdy;
                    fVar106 = fVar108;
                    iVar80 = iVar41;
                    if (fVar108 < fVar103) {
                      fVar105 = fVar86 - fVar99;
                      fVar99 = (fVar86 - fVar104) + fVar87;
                      fVar102 = -fVar102;
                      fVar106 = fVar103;
                      fVar60 = fVar109;
                      fVar104 = fVar105 + fVar87;
                      iVar80 = iVar43;
                      iVar43 = iVar41;
                      fVar103 = fVar108;
                    }
                    iVar41 = iVar80 + 1;
                    fVar108 = ((float)iVar41 - fVar60) * fVar102 + fVar86;
                    fVar60 = psVar67->direction;
                    fVar109 = (fVar108 - fVar99) * fVar60;
                    *(float *)((long)&scanline->data + (long)iVar80 * 4) =
                         (1.0 - ((fVar103 - (float)iVar80) + 1.0) * 0.5) * fVar109 +
                         *(float *)((long)&scanline->data + (long)iVar80 * 4);
                    lVar61 = (long)iVar43;
                    for (lVar54 = (long)iVar41; lVar54 < lVar61; lVar54 = lVar54 + 1) {
                      *(float *)((long)&scanline->data + lVar54 * 4) =
                           fVar102 * fVar60 * 0.5 + fVar109 +
                           *(float *)((long)&scanline->data + lVar54 * 4);
                      fVar109 = fVar109 + fVar102 * fVar60;
                    }
                    *(float *)((long)&scanline->data + lVar61 * 4) =
                         (fVar104 - (fVar102 * (float)(iVar43 - iVar41) + fVar108)) *
                         (((fVar106 - (float)iVar43) + 0.0) * -0.5 + 1.0) * fVar60 + fVar109 +
                         *(float *)((long)&scanline->data + lVar61 * 4);
                    fVar60 = (fVar104 - fVar99) * fVar60;
                  }
                  pfStack_400[lVar61 + 1] = fVar60 + pfStack_400[lVar61 + 1];
                  goto LAB_0012c60b;
                }
              }
              fStack_308 = fVar60;
              uStack_304 = 0;
              uStack_300 = 0;
              uStack_2fc = 0;
              auStack_3a8 = ZEXT416((uint)fVar109);
              fStack_368 = fVar102;
              fVar60 = 0.0;
              while (fStack_454 != fVar60) {
                fVar103 = (float)(int)fVar60;
                fVar102 = (float)(int)((int)fVar60 + 1U);
                fVar99 = (fVar103 - fStack_308) / fStack_368 + fVar86;
                fVar104 = (fVar102 - fStack_308) / fStack_368 + fVar86;
                uStack_490 = CONCAT44(uStack_490._4_4_,fVar103);
                if ((fVar103 <= fStack_308) || (fVar109 <= fVar102)) {
                  if ((fVar109 < fVar103) && (fVar102 < fStack_308)) {
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar60,psVar67,fStack_308,fVar86,fVar102,
                               fVar104);
                    fVar108 = fVar104;
                    fVar106 = fVar102;
                    fVar103 = (float)uStack_490;
LAB_0012c3b3:
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar60,psVar67,fVar106,fVar108,fVar103,fVar99)
                    ;
                    fVar102 = (float)uStack_490;
                    goto LAB_0012c3cd;
                  }
                  fVar108 = fVar86;
                  fVar106 = fStack_308;
                  if (((fStack_308 < fVar103) && (fVar103 < fVar109)) ||
                     ((fVar109 < fVar103 && (fVar103 < fStack_308)))) goto LAB_0012c3b3;
                  fVar99 = fVar86;
                  fVar103 = fStack_308;
                  if (((fStack_308 < fVar102) && (fVar102 < fVar109)) ||
                     ((fVar109 < fVar102 && (fVar102 < fStack_308)))) goto LAB_0012c31b;
                }
                else {
                  stbtt__handle_clipped_edge
                            ((float *)scanline,(int)fVar60,psVar67,fStack_308,fVar86,fVar103,fVar99)
                  ;
                  fVar103 = (float)uStack_490;
LAB_0012c31b:
                  stbtt__handle_clipped_edge
                            ((float *)scanline,(int)fVar60,psVar67,fVar103,fVar99,fVar102,fVar104);
                  fVar99 = fVar104;
LAB_0012c3cd:
                  fVar103 = fVar102;
                  fVar109 = (float)auStack_3a8._0_4_;
                }
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar60,psVar67,fVar103,fVar99,fVar109,fVar87);
                fVar109 = (float)auStack_3a8._0_4_;
                fVar60 = (float)((int)fVar60 + 1U);
              }
            }
            else if (fVar60 < fStack_41c) {
              if (0.0 <= fVar60) {
                uStack_304 = 0;
                uStack_300 = 0;
                uStack_2fc = 0;
                fStack_308 = fVar60;
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar60,psVar67,fVar60,fVar86,fVar60,fVar87);
                iVar41 = (int)fVar60 + 1;
                fVar60 = fStack_308;
              }
              else {
                iVar41 = 0;
              }
              stbtt__handle_clipped_edge(pfStack_400,iVar41,psVar67,fVar60,fVar86,fVar60,fVar87);
            }
LAB_0012c60b:
            ptr_01 = psStack_430;
          }
        }
        fVar86 = 0.0;
        uVar78 = uStack_2b8 & 0xffffffff;
        lVar61 = lStack_2d8;
        psVar58 = scanline;
        while (bVar34 = lVar61 != 0, lVar61 = lVar61 + -1, bVar34) {
          fVar86 = fVar86 + *(float *)((long)&psVar58->data + lStack_2d0 * 4);
          iVar41 = (int)(ABS(*(float *)&psVar58->data + fVar86) * 255.0 + 0.5);
          if (0xfe < iVar41) {
            iVar41 = 0xff;
          }
          puStack_378[(int)uVar78] = (uchar)iVar41;
          uVar78 = (ulong)((int)uVar78 + 1);
          psVar58 = (stbtt__buf *)((long)&psVar58->data + 4);
        }
        plVar50 = (long *)auStack_470;
        while (plVar50 = (long *)*plVar50, plVar50 != (long *)0x0) {
          *(float *)(plVar50 + 1) = *(float *)((long)plVar50 + 0xc) + *(float *)(plVar50 + 1);
        }
        uVar69 = (ulong)(iStack_370 + 1);
        uVar78 = (ulong)(uint)((int)uStack_2b8 + iStack_498);
        iVar41 = iStack_3f0 + 1;
      }
      while (puVar48 != (undefined8 *)0x0) {
        puVar13 = (undefined8 *)*puVar48;
        ImGui::MemFree(puVar48);
        puVar48 = puVar13;
      }
      if (scanline != asStack_238) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(psStack_438);
    }
    ImGui::MemFree(pvStack_450);
    ImGui::MemFree(ptr_01);
  }
LAB_0012c713:
  ImGui::MemFree((void *)CONCAT44(uStack_428._4_4_,(uint)uStack_428));
  uVar65 = *(uint *)(lStack_3b8 + 8);
  uVar66 = *(uint *)(lStack_3b8 + 4);
  if (1 < (byte)uStack_310) {
    lVar61 = (long)(int)((uVar65 >> 0x10) * iStack_498);
    puVar45 = puStack_390 + lVar61 + (ulong)(ushort)uVar65;
    iVar41 = (uVar66 & 0xffff) - (int)(float)uStack_488;
    asStack_238[0].data._0_4_ = 0;
    asStack_238[0].data._4_4_ = 0;
    if (iVar41 < 0) {
      iVar41 = -1;
    }
    uVar78 = (long)iVar41 + 1;
    puVar82 = puStack_2e8 + lVar61 + (ulong)(ushort)uVar65 + (long)iVar41;
    for (uVar65 = 0; uVar69 = uStack_310, uVar65 != uVar66 >> 0x10; uVar65 = uVar65 + 1) {
      memset(asStack_238,0,uStack_310);
      puVar73 = puVar82;
      uVar56 = uVar78;
      switch((int)uVar69) {
      case 2:
        uVar69 = 0;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = puVar45[uVar72];
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 + 2 & 7)) = bVar85;
          uVar53 = (int)uVar69 + ((uint)bVar85 - (uint)bVar7);
          uVar69 = (ulong)uVar53;
          puVar45[uVar72] = (uchar)(uVar53 >> 1);
        }
        break;
      case 3:
        uVar69 = 0;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = puVar45[uVar72];
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 + 3 & 7)) = bVar85;
          uVar69 = (ulong)((int)uVar69 + ((uint)bVar85 - (uint)bVar7));
          puVar45[uVar72] = (uchar)(uVar69 / 3);
        }
        break;
      case 4:
        uVar69 = 0;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = puVar45[uVar72];
          uVar71 = (ulong)((uint)uVar72 & 7);
          bVar7 = *(byte *)((long)&asStack_238[0].data + uVar71);
          *(byte *)((long)&asStack_238[0].data + (uVar71 ^ 4)) = bVar85;
          uVar53 = (int)uVar69 + ((uint)bVar85 - (uint)bVar7);
          uVar69 = (ulong)uVar53;
          puVar45[uVar72] = (uchar)(uVar53 >> 2);
        }
        break;
      case 5:
        uVar69 = 0;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = puVar45[uVar72];
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 + 5 & 7)) = bVar85;
          uVar69 = (ulong)((int)uVar69 + ((uint)bVar85 - (uint)bVar7));
          puVar45[uVar72] = (uchar)(uVar69 / 5);
        }
        break;
      default:
        uVar69 = 0;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = puVar45[uVar72];
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uStack_488 + (uint)uVar72 & 7)) =
               bVar85;
          uVar69 = (ulong)((int)uVar69 + ((uint)bVar85 - (uint)bVar7));
          puVar45[uVar72] = (uchar)(uVar69 / ((ulong)uStack_488 & 0xffffffff));
        }
      }
      for (; uVar56 < (uVar66 & 0xffff); uVar56 = uVar56 + 1) {
        uVar53 = (int)uVar69 -
                 (uint)*(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar56 & 7));
        uVar69 = (ulong)uVar53;
        *puVar73 = (uchar)(uVar53 / (uint)uStack_488);
        puVar73 = puVar73 + 1;
      }
      puVar45 = puVar45 + lVar81;
      puVar82 = puVar82 + lVar81;
    }
    uVar65 = *(uint *)(lStack_3b8 + 8);
    uVar66 = *(uint *)(lStack_3b8 + 4);
  }
  if (1 < (byte)uStack_318) {
    lVar61 = (long)(int)((uVar65 >> 0x10) * iStack_498);
    pbVar63 = puStack_390 + lVar61 + (ulong)(ushort)uVar65;
    uVar51 = (ushort)(uVar66 >> 0x10);
    asStack_238[0].data._0_4_ = 0;
    asStack_238[0].data._4_4_ = 0;
    iVar41 = (uint)uVar51 - auStack_448._0_4_;
    if (iVar41 < 0) {
      iVar41 = -1;
    }
    uVar78 = (long)iVar41 + 1;
    puVar45 = puStack_390 + lVar81 * uVar78 + lVar61 + (ulong)(ushort)uVar65;
    for (uVar65 = 0; uVar69 = uStack_318, uVar65 != (uVar66 & 0xffff); uVar65 = uVar65 + 1) {
      memset(asStack_238,0,uStack_318);
      puVar82 = puVar45;
      uVar56 = uVar78;
      switch((int)uVar69) {
      case 2:
        uVar69 = 0;
        pbVar74 = pbVar63;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = *pbVar74;
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 + 2 & 7)) = bVar85;
          uVar53 = (int)uVar69 + ((uint)bVar85 - (uint)bVar7);
          uVar69 = (ulong)uVar53;
          *pbVar74 = (byte)(uVar53 >> 1);
          pbVar74 = pbVar74 + lVar81;
        }
        break;
      case 3:
        uVar69 = 0;
        pbVar74 = pbVar63;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = *pbVar74;
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 + 3 & 7)) = bVar85;
          uVar69 = (ulong)((int)uVar69 + ((uint)bVar85 - (uint)bVar7));
          *pbVar74 = (byte)(uVar69 / 3);
          pbVar74 = pbVar74 + lVar81;
        }
        break;
      case 4:
        uVar69 = 0;
        pbVar74 = pbVar63;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = *pbVar74;
          uVar71 = (ulong)((uint)uVar72 & 7);
          bVar7 = *(byte *)((long)&asStack_238[0].data + uVar71);
          *(byte *)((long)&asStack_238[0].data + (uVar71 ^ 4)) = bVar85;
          uVar53 = (int)uVar69 + ((uint)bVar85 - (uint)bVar7);
          uVar69 = (ulong)uVar53;
          *pbVar74 = (byte)(uVar53 >> 2);
          pbVar74 = pbVar74 + lVar81;
        }
        break;
      case 5:
        uVar69 = 0;
        pbVar74 = pbVar63;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = *pbVar74;
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 + 5 & 7)) = bVar85;
          uVar69 = (ulong)((int)uVar69 + ((uint)bVar85 - (uint)bVar7));
          *pbVar74 = (byte)(uVar69 / 5);
          pbVar74 = pbVar74 + lVar81;
        }
        break;
      default:
        uVar69 = 0;
        pbVar74 = pbVar63;
        for (uVar72 = 0; uVar78 != uVar72; uVar72 = uVar72 + 1) {
          bVar85 = *pbVar74;
          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar72 & 7));
          *(byte *)((long)&asStack_238[0].data + (ulong)(auStack_448._0_4_ + (uint)uVar72 & 7)) =
               bVar85;
          uVar69 = (ulong)((int)uVar69 + ((uint)bVar85 - (uint)bVar7));
          *pbVar74 = (byte)(uVar69 / (auStack_448._0_8_ & 0xffffffff));
          pbVar74 = pbVar74 + lVar81;
        }
      }
      for (; uVar56 < uVar51; uVar56 = uVar56 + 1) {
        uVar53 = (int)uVar69 -
                 (uint)*(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar56 & 7));
        uVar69 = (ulong)uVar53;
        *puVar82 = (uchar)(uVar53 / auStack_448._0_4_);
        puVar82 = puVar82 + lVar81;
      }
      pbVar63 = pbVar63 + 1;
      puVar45 = puVar45 + 1;
    }
    uVar65 = *(uint *)(lStack_3b8 + 8);
    uVar66 = *(uint *)(lStack_3b8 + 4);
  }
  auVar100 = (undefined1  [16])0x0;
  *puStack_338 = uVar65;
  uVar51 = (ushort)(uVar66 >> 0x10);
  puStack_338[1] = CONCAT22((short)(uVar65 >> 0x10) + uVar51,(short)uVar65 + (short)uVar66);
  puStack_338[4] =
       (uint)((float)(int)(short)((ushort)(uStack_3f4 << 8) | (ushort)uStack_3f8) * fStack_248);
  *(ulong *)(puStack_338 + 2) =
       CONCAT44((float)iStack_364 * auStack_268._4_4_ + (float)auStack_258._4_4_,
                (float)(int)fStack_360 * auStack_268._0_4_ + (float)auStack_258._0_4_);
  *(ulong *)(puStack_338 + 5) =
       CONCAT44((float)(int)((uint)uVar51 + iStack_364) * auStack_268._4_4_ +
                (float)auStack_258._4_4_,
                (float)(int)((uVar66 & 0xffff) + (int)fStack_360) * auStack_268._0_4_ +
                (float)auStack_258._0_4_);
  lVar59 = lStack_330;
  lVar54 = lStack_328;
  ptr_00 = psStack_348;
  psVar83 = psStack_388;
  lVar61 = lStack_2e0;
  fVar86 = fStack_360;
LAB_0012ccb6:
  lVar54 = lVar54 + 1;
  lVar59 = lVar59 + 1;
  goto LAB_0012b749;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}